

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void capnp::compiler::findImports
               (Reader paramList,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  short sVar1;
  Reader exp;
  Reader exp_00;
  Reader exp_01;
  ListElementCount LVar2;
  Reader ann;
  Reader param;
  IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
  local_1a0;
  IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
  local_190;
  Reader local_180;
  Reader local_150;
  Reader local_120;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  if (0xf < paramList._reader.dataSize) {
    sVar1 = *paramList._reader.data;
    if (sVar1 == 2) {
      local_f0.reader.segment = (SegmentReader *)0x1a6c31;
      local_f0.reader.capTable = (CapTableReader *)0x14;
      std::
      _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
      ::_M_insert_unique<kj::StringPtr>(&output->_M_t,(StringPtr *)&local_f0);
      return;
    }
    if (sVar1 == 1) {
      Declaration::ParamList::Reader::getType(&local_c0,&paramList);
      exp_01._reader.capTable = local_c0._reader.capTable;
      exp_01._reader.segment = local_c0._reader.segment;
      exp_01._reader.data = local_c0._reader.data;
      exp_01._reader.pointers = local_c0._reader.pointers;
      exp_01._reader.dataSize = local_c0._reader.dataSize;
      exp_01._reader.pointerCount = local_c0._reader.pointerCount;
      exp_01._reader._38_2_ = local_c0._reader._38_2_;
      exp_01._reader.nestingLimit = local_c0._reader.nestingLimit;
      exp_01._reader._44_4_ = local_c0._reader._44_4_;
      findImports(exp_01,output);
      return;
    }
    if (sVar1 != 0) {
      return;
    }
  }
  Declaration::ParamList::Reader::getNamedList(&local_f0,&paramList);
  local_190.container = &local_f0;
  for (local_190.index = 0; local_190.index != local_f0.reader.elementCount;
      local_190.index = local_190.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Param::Reader>
    ::operator*(&local_60,&local_190);
    Declaration::Param::Reader::getType(&local_150,&local_60);
    exp._reader.capTable = local_150._reader.capTable;
    exp._reader.segment = local_150._reader.segment;
    exp._reader.data = local_150._reader.data;
    exp._reader.pointers = local_150._reader.pointers;
    exp._reader.dataSize = local_150._reader.dataSize;
    exp._reader.pointerCount = local_150._reader.pointerCount;
    exp._reader._38_2_ = local_150._reader._38_2_;
    exp._reader.nestingLimit = local_150._reader.nestingLimit;
    exp._reader._44_4_ = local_150._reader._44_4_;
    findImports(exp,output);
    Declaration::Param::Reader::getAnnotations(&local_120,&local_60);
    LVar2 = local_120.reader.elementCount;
    local_1a0.container = &local_120;
    for (local_1a0.index = 0; local_1a0.index != LVar2; local_1a0.index = local_1a0.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
      ::operator*(&local_90,&local_1a0);
      Declaration::AnnotationApplication::Reader::getName(&local_180,&local_90);
      exp_00._reader.capTable = local_180._reader.capTable;
      exp_00._reader.segment = local_180._reader.segment;
      exp_00._reader.data = local_180._reader.data;
      exp_00._reader.pointers = local_180._reader.pointers;
      exp_00._reader.dataSize = local_180._reader.dataSize;
      exp_00._reader.pointerCount = local_180._reader.pointerCount;
      exp_00._reader._38_2_ = local_180._reader._38_2_;
      exp_00._reader.nestingLimit = local_180._reader.nestingLimit;
      exp_00._reader._44_4_ = local_180._reader._44_4_;
      findImports(exp_00,output);
    }
  }
  return;
}

Assistant:

static void findImports(Declaration::ParamList::Reader paramList, std::set<kj::StringPtr>& output) {
  switch (paramList.which()) {
    case Declaration::ParamList::NAMED_LIST:
      for (auto param: paramList.getNamedList()) {
        findImports(param.getType(), output);
        for (auto ann: param.getAnnotations()) {
          findImports(ann.getName(), output);
        }
      }
      break;
    case Declaration::ParamList::TYPE:
      findImports(paramList.getType(), output);
      break;
    case Declaration::ParamList::STREAM:
      output.insert("/capnp/stream.capnp");
      break;
  }
}